

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O3

void __thiscall RenX::Server::banCheck(Server *this,PlayerInfo *player)

{
  ushort uVar1;
  uint uVar2;
  pointer puVar3;
  long lVar4;
  uint64_t uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  size_type sVar8;
  PlayerInfo *pPVar9;
  bool bVar10;
  char cVar11;
  uint uVar12;
  int iVar13;
  vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
  *pvVar14;
  size_type sVar15;
  tm *ptVar16;
  PlayerInfo *pPVar17;
  undefined8 uVar18;
  long lVar19;
  size_t __n;
  undefined8 *puVar20;
  PlayerInfo *extraout_RDX;
  PlayerInfo *extraout_RDX_00;
  PlayerInfo *extraout_RDX_01;
  PlayerInfo *extraout_RDX_02;
  PlayerInfo *extraout_RDX_03;
  duration player_00;
  PlayerInfo *extraout_RDX_08;
  PlayerInfo *extraout_RDX_11;
  PlayerInfo *extraout_RDX_14;
  PlayerInfo *extraout_RDX_17;
  PlayerInfo *extraout_RDX_19;
  size_type __rlen;
  PlayerInfo *pPVar21;
  pointer puVar22;
  undefined8 *puVar23;
  Server *pSVar24;
  Entry *pEVar25;
  PlayerInfo *pPVar26;
  PlayerInfo *pPVar27;
  PlayerInfo *pPVar28;
  undefined8 *puVar29;
  undefined1 auVar30 [16];
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  string_view in_reason;
  string_view message;
  string_view in_reason_00;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view message_08;
  string fmtName;
  time_t current_time;
  string channel_message;
  char timeStr [256];
  string local_1c8;
  PlayerInfo *local_1a8;
  PlayerInfo *local_1a0;
  PlayerInfo *local_198;
  Server *local_190;
  PlayerInfo *local_188;
  PlayerInfo *local_180;
  string local_178;
  string local_158;
  basic_string_view<char,_std::char_traits<char>_> local_138 [16];
  PlayerInfo *extraout_RDX_04;
  PlayerInfo *extraout_RDX_05;
  PlayerInfo *extraout_RDX_06;
  PlayerInfo *extraout_RDX_07;
  PlayerInfo *extraout_RDX_09;
  PlayerInfo *extraout_RDX_10;
  PlayerInfo *extraout_RDX_12;
  PlayerInfo *extraout_RDX_13;
  PlayerInfo *extraout_RDX_15;
  PlayerInfo *extraout_RDX_16;
  PlayerInfo *extraout_RDX_18;
  
  if ((player->exemption_flags & 6) == 0) {
    local_190 = this;
    pvVar14 = BanDatabase::getEntries((BanDatabase *)banDatabase);
    puVar22 = (pvVar14->
              super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (pvVar14->
             super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (puVar22 != puVar3) {
      pPVar17 = (PlayerInfo *)0x0;
      pPVar21 = (PlayerInfo *)0x0;
      local_180 = (PlayerInfo *)0x0;
      local_1a8 = (PlayerInfo *)0x0;
      local_188 = (PlayerInfo *)0x0;
      local_1a0 = (PlayerInfo *)0x0;
      local_198 = (PlayerInfo *)0x0;
      player_00.__r = (rep)extraout_RDX;
      do {
        pEVar25 = (puVar22->_M_t).
                  super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
        if ((short)pEVar25->flags < 0) {
          lVar19 = (pEVar25->length).__r;
          if (lVar19 != 0) {
            lVar4 = (pEVar25->timestamp).__d.__r;
            auVar30 = std::chrono::_V2::system_clock::now();
            player_00.__r = auVar30._8_8_;
            pEVar25 = (puVar22->_M_t).
                      super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                      .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
            if (lVar19 * 1000000000 + lVar4 < auVar30._0_8_) {
              BanDatabase::deactivate((BanDatabase *)banDatabase,pEVar25);
              player_00.__r = (rep)extraout_RDX_00;
              goto LAB_001323b4;
            }
          }
          uVar12 = 0xffffffff;
          if (pEVar25->prefix_length < 0x20) {
            uVar12 = Jupiter_prefix_length_to_netmask(pEVar25->prefix_length);
            player_00.__r = (rep)extraout_RDX_01;
          }
          if ((((local_190->m_localSteamBan == true) &&
               (uVar5 = ((puVar22->_M_t).
                         super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                         .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl)->
                        steamid, uVar5 != 0)) && (uVar5 == player->steamid)) ||
             (((local_190->m_localIPBan == true &&
               (uVar2 = ((puVar22->_M_t).
                         super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                         .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl)->ip
               , uVar2 != 0)) && (((uVar2 ^ player->ip32) & uVar12) == 0)))) {
LAB_00132552:
            pPVar26 = (PlayerInfo *)
                      (puVar22->_M_t).
                      super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                      .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
            uVar1 = *(ushort *)((long)&pPVar26->name + 8);
            player->ban_flags = player->ban_flags | uVar1;
            if (-1 < (char)uVar1) goto LAB_001325ac;
            if (pPVar17 == (PlayerInfo *)0x0) {
LAB_001325a9:
              pPVar17 = pPVar26;
            }
            else {
              player_00.__r = ((seconds *)((long)&pPVar17->name + 0x18))->__r;
              lVar19 = ((seconds *)((long)&pPVar26->name + 0x18))->__r;
              if ((PlayerInfo *)player_00.__r == (PlayerInfo *)0x0) {
                if ((lVar19 == 0) &&
                   (player_00.__r =
                         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity,
                   player_00.__r <
                   (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&pPVar17->name + 0x10))->_M_allocated_capacity))
                goto LAB_001325a9;
              }
              else if ((lVar19 == 0) ||
                      (player_00.__r =
                            player_00.__r * 1000000000 +
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar17->name + 0x10))->_M_allocated_capacity,
                      player_00.__r <
                      (long)(lVar19 * 1000000000 +
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity)))
              goto LAB_001325a9;
            }
LAB_001325ac:
            if ((uVar1 & 0x40) == 0) goto LAB_001325f7;
            if (pPVar21 == (PlayerInfo *)0x0) {
LAB_001325f4:
              pPVar21 = pPVar26;
            }
            else {
              player_00.__r = ((seconds *)((long)&pPVar21->name + 0x18))->__r;
              lVar19 = ((seconds *)((long)&pPVar26->name + 0x18))->__r;
              if ((PlayerInfo *)player_00.__r == (PlayerInfo *)0x0) {
                if ((lVar19 == 0) &&
                   (player_00.__r =
                         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity,
                   player_00.__r <
                   (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&pPVar21->name + 0x10))->_M_allocated_capacity))
                goto LAB_001325f4;
              }
              else if ((lVar19 == 0) ||
                      (player_00.__r =
                            player_00.__r * 1000000000 +
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar21->name + 0x10))->_M_allocated_capacity,
                      player_00.__r <
                      (long)(lVar19 * 1000000000 +
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity)))
              goto LAB_001325f4;
            }
LAB_001325f7:
            if ((uVar1 & 0x20) == 0) goto LAB_00132656;
            if (local_180 == (PlayerInfo *)0x0) {
LAB_00132651:
              local_180 = pPVar26;
            }
            else {
              player_00.__r = ((seconds *)((long)&local_180->name + 0x18))->__r;
              lVar19 = ((seconds *)((long)&pPVar26->name + 0x18))->__r;
              if ((PlayerInfo *)player_00.__r == (PlayerInfo *)0x0) {
                if ((lVar19 == 0) &&
                   (player_00.__r =
                         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity,
                   player_00.__r <
                   (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&local_180->name + 0x10))->_M_allocated_capacity))
                goto LAB_00132651;
              }
              else if ((lVar19 == 0) ||
                      (player_00.__r =
                            player_00.__r * 1000000000 +
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&local_180->name + 0x10))->_M_allocated_capacity,
                      player_00.__r <
                      (long)(lVar19 * 1000000000 +
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity)))
              goto LAB_00132651;
            }
LAB_00132656:
            if ((uVar1 & 0x10) == 0) goto LAB_001326b5;
            if (local_1a8 == (PlayerInfo *)0x0) {
LAB_001326b0:
              local_1a8 = pPVar26;
            }
            else {
              player_00.__r = ((seconds *)((long)&local_1a8->name + 0x18))->__r;
              lVar19 = ((seconds *)((long)&pPVar26->name + 0x18))->__r;
              if ((PlayerInfo *)player_00.__r == (PlayerInfo *)0x0) {
                if ((lVar19 == 0) &&
                   (player_00.__r =
                         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity,
                   player_00.__r <
                   (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&local_1a8->name + 0x10))->_M_allocated_capacity))
                goto LAB_001326b0;
              }
              else if ((lVar19 == 0) ||
                      (player_00.__r =
                            player_00.__r * 1000000000 +
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&local_1a8->name + 0x10))->_M_allocated_capacity,
                      player_00.__r <
                      (long)(lVar19 * 1000000000 +
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity)))
              goto LAB_001326b0;
            }
LAB_001326b5:
            if ((uVar1 & 8) == 0) goto LAB_00132714;
            if (local_188 == (PlayerInfo *)0x0) {
LAB_0013270f:
              local_188 = pPVar26;
            }
            else {
              player_00.__r = ((seconds *)((long)&local_188->name + 0x18))->__r;
              lVar19 = ((seconds *)((long)&pPVar26->name + 0x18))->__r;
              if ((PlayerInfo *)player_00.__r == (PlayerInfo *)0x0) {
                if ((lVar19 == 0) &&
                   (player_00.__r =
                         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity,
                   player_00.__r <
                   (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&local_188->name + 0x10))->_M_allocated_capacity))
                goto LAB_0013270f;
              }
              else if ((lVar19 == 0) ||
                      (player_00.__r =
                            player_00.__r * 1000000000 +
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&local_188->name + 0x10))->_M_allocated_capacity,
                      player_00.__r <
                      (long)(lVar19 * 1000000000 +
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity)))
              goto LAB_0013270f;
            }
LAB_00132714:
            if ((uVar1 & 4) == 0) goto LAB_00132773;
            if (local_1a0 == (PlayerInfo *)0x0) {
LAB_0013276e:
              local_1a0 = pPVar26;
            }
            else {
              player_00.__r = ((seconds *)((long)&local_1a0->name + 0x18))->__r;
              lVar19 = ((seconds *)((long)&pPVar26->name + 0x18))->__r;
              if ((PlayerInfo *)player_00.__r == (PlayerInfo *)0x0) {
                if ((lVar19 == 0) &&
                   (player_00.__r =
                         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity,
                   player_00.__r <
                   (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&local_1a0->name + 0x10))->_M_allocated_capacity))
                goto LAB_0013276e;
              }
              else if ((lVar19 == 0) ||
                      (player_00.__r =
                            player_00.__r * 1000000000 +
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&local_1a0->name + 0x10))->_M_allocated_capacity,
                      player_00.__r <
                      (long)(lVar19 * 1000000000 +
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity)))
              goto LAB_0013276e;
            }
LAB_00132773:
            if ((uVar1 & 2) != 0) {
              if (local_198 == (PlayerInfo *)0x0) {
LAB_001327da:
                local_198 = pPVar26;
              }
              else {
                lVar19 = *(long *)((long)&(local_198->name).field_2 + 8);
                player_00.__r = ((seconds *)((long)&pPVar26->name + 0x18))->__r;
                if (lVar19 == 0) {
                  if (((PlayerInfo *)player_00.__r == (PlayerInfo *)0x0) &&
                     (player_00.__r = (rep)local_198,
                     (long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity <
                     (long)(local_198->name).field_2._M_allocated_capacity)) goto LAB_001327da;
                }
                else if (((PlayerInfo *)player_00.__r == (PlayerInfo *)0x0) ||
                        (player_00.__r =
                              player_00.__r * 1000000000 +
                              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity,
                        (long)(lVar19 * 1000000000 + (local_198->name).field_2._M_allocated_capacity
                              ) < player_00.__r)) goto LAB_001327da;
              }
            }
          }
          else {
            if (local_190->m_localHWIDBan == true) {
              pEVar25 = (puVar22->_M_t).
                        super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                        .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
              player_00.__r = (pEVar25->hwid)._M_string_length;
              if ((((PlayerInfo *)player_00.__r != (PlayerInfo *)0x0) &&
                  ((PlayerInfo *)player_00.__r == (PlayerInfo *)(player->hwid)._M_string_length)) &&
                 (iVar13 = bcmp((pEVar25->hwid)._M_dataplus._M_p,(player->hwid)._M_dataplus._M_p,
                                player_00.__r), player_00.__r = (rep)extraout_RDX_02, iVar13 == 0))
              goto LAB_00132552;
            }
            if (((local_190->m_localRDNSBan == true) &&
                (pEVar25 = (puVar22->_M_t).
                           super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                           .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl,
                (pEVar25->rdns)._M_string_length != 0)) && ((pEVar25->flags & 0x4000) != 0)) {
              p_Var6 = (player->m_rdns_ptr).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              if (((p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                  (p_Var6->_M_use_count != 1)) ||
                 (peVar7 = (player->m_rdns_ptr).
                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr, peVar7 == (element_type *)0x0)) {
                local_138[0]._M_len = 0;
                local_138[0]._M_str = (pointer)0x0;
              }
              else {
                local_138[0]._M_str = (peVar7->_M_dataplus)._M_p;
                local_138[0]._M_len = peVar7->_M_string_length;
              }
              pEVar25 = (puVar22->_M_t).
                        super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                        .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
              sVar15 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                 (local_138,(pEVar25->rdns)._M_dataplus._M_p,0,
                                  (pEVar25->rdns)._M_string_length);
              player_00.__r = (rep)extraout_RDX_03;
              if (sVar15 != 0xffffffffffffffff) goto LAB_00132552;
            }
            if (local_190->m_localNameBan == true) {
              pEVar25 = (puVar22->_M_t).
                        super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                        .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
              sVar8 = (pEVar25->name)._M_string_length;
              if ((sVar8 != 0) &&
                 (lhs._M_str = (pEVar25->name)._M_dataplus._M_p, lhs._M_len = sVar8,
                 rhs._M_str = (player->name)._M_dataplus._M_p,
                 rhs._M_len = (player->name)._M_string_length,
                 bVar10 = jessilib::equalsi<char,char>(lhs,rhs),
                 player_00.__r = (rep)extraout_RDX_04, bVar10)) goto LAB_00132552;
            }
          }
        }
LAB_001323b4:
        pPVar9 = local_180;
        pPVar27 = local_188;
        pSVar24 = local_190;
        pPVar28 = local_198;
        pPVar26 = local_1a0;
        puVar22 = puVar22 + 1;
      } while (puVar22 != puVar3);
      if (pPVar17 == (PlayerInfo *)0x0) {
        if (pPVar21 == (PlayerInfo *)0x0) {
          pPVar21 = local_1a8;
          if (local_180 != (PlayerInfo *)0x0) {
            local_178._M_dataplus._M_p =
                 (pointer)((long)(((seconds *)((long)&local_180->name + 0x18))->__r * 1000000000 +
                                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)((long)&local_180->name + 0x10))->_M_allocated_capacity) /
                          1000000000);
            ptVar16 = localtime((time_t *)&local_178);
            strftime((char *)local_138,0x100,"%b %d %Y at %H:%M:%S",ptVar16);
            if (((seconds *)((long)&pPVar9->name + 0x18))->__r == 0) {
              string_printf_abi_cxx11_
                        (&local_1c8,"You were permanently bot-muted from %.*s on %s for: %.*s",
                         (pSVar24->m_ban_from_str)._M_string_length,
                         (pSVar24->m_ban_from_str)._M_dataplus._M_p,local_138,
                         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&pPVar9->vehicle + 0x18))->_M_allocated_capacity,
                         (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)((long)&pPVar9->vehicle + 0x10))->_M_allocated_capacity);
              message_08._M_str = local_1c8._M_dataplus._M_p;
              message_08._M_len = local_1c8._M_string_length;
              sendMessage(pSVar24,player,message_08);
              player_00.__r = (rep)extraout_RDX_18;
            }
            else {
              string_printf_abi_cxx11_
                        (&local_1c8,"You are bot-muted from %.*s until %s for: %.*s",
                         (pSVar24->m_ban_from_str)._M_string_length,
                         (pSVar24->m_ban_from_str)._M_dataplus._M_p,local_138,
                         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&pPVar9->vehicle + 0x18))->_M_allocated_capacity,
                         (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)((long)&pPVar9->vehicle + 0x10))->_M_allocated_capacity);
              message_00._M_str = local_1c8._M_dataplus._M_p;
              message_00._M_len = local_1c8._M_string_length;
              sendMessage(pSVar24,player,message_00);
              player_00.__r = (rep)extraout_RDX_06;
            }
            pPVar21 = local_1a8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
              player_00.__r = (rep)extraout_RDX_19;
            }
          }
        }
        else {
          local_178._M_dataplus._M_p =
               (pointer)((long)(((seconds *)((long)&pPVar21->name + 0x18))->__r * 1000000000 +
                               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)((long)&pPVar21->name + 0x10))->_M_allocated_capacity) /
                        1000000000);
          ptVar16 = localtime((time_t *)&local_178);
          strftime((char *)local_138,0x100,"%b %d %Y at %H:%M:%S",ptVar16);
          mute(pSVar24,player);
          pPVar27 = local_188;
          pPVar28 = local_198;
          pPVar26 = local_1a0;
          if (((seconds *)((long)&pPVar21->name + 0x18))->__r == 0) {
            string_printf_abi_cxx11_
                      (&local_1c8,"You were permanently muted from %.*s on %s for: %.*s",
                       (pSVar24->m_ban_from_str)._M_string_length,
                       (pSVar24->m_ban_from_str)._M_dataplus._M_p,local_138,
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&pPVar21->vehicle + 0x18))->_M_allocated_capacity,
                       (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar21->vehicle + 0x10))->_M_allocated_capacity);
            message_01._M_str = local_1c8._M_dataplus._M_p;
            message_01._M_len = local_1c8._M_string_length;
            sendMessage(pSVar24,player,message_01);
            player_00.__r = (rep)extraout_RDX_07;
          }
          else {
            string_printf_abi_cxx11_
                      (&local_1c8,"You are muted from %.*s until %s for: %.*s",
                       (pSVar24->m_ban_from_str)._M_string_length,
                       (pSVar24->m_ban_from_str)._M_dataplus._M_p,local_138,
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&pPVar21->vehicle + 0x18))->_M_allocated_capacity,
                       (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar21->vehicle + 0x10))->_M_allocated_capacity);
            message._M_str = local_1c8._M_dataplus._M_p;
            message._M_len = local_1c8._M_string_length;
            sendMessage(pSVar24,player,message);
            player_00.__r = (rep)extraout_RDX_05;
          }
          pPVar21 = local_1a8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
            player_00.__r = (rep)extraout_RDX_08;
          }
          *(byte *)&player->ban_flags = (byte)player->ban_flags | 0x20;
        }
        if (pPVar21 != (PlayerInfo *)0x0) {
          local_178._M_dataplus._M_p =
               (pointer)((long)(((seconds *)((long)&pPVar21->name + 0x18))->__r * 1000000000 +
                               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)((long)&pPVar21->name + 0x10))->_M_allocated_capacity) /
                        1000000000);
          ptVar16 = localtime((time_t *)&local_178);
          strftime((char *)local_138,0x100,"%b %d %Y at %H:%M:%S",ptVar16);
          if (((seconds *)((long)&pPVar21->name + 0x18))->__r == 0) {
            string_printf_abi_cxx11_
                      (&local_1c8,"You were permanently vote-muted from %.*s on %s for: %.*s",
                       (pSVar24->m_ban_from_str)._M_string_length,
                       (pSVar24->m_ban_from_str)._M_dataplus._M_p,local_138,
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&pPVar21->vehicle + 0x18))->_M_allocated_capacity,
                       (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar21->vehicle + 0x10))->_M_allocated_capacity);
            message_03._M_str = local_1c8._M_dataplus._M_p;
            message_03._M_len = local_1c8._M_string_length;
            sendMessage(pSVar24,player,message_03);
            player_00.__r = (rep)extraout_RDX_10;
          }
          else {
            string_printf_abi_cxx11_
                      (&local_1c8,"You are vote-muted from %.*s until %s for: %.*s",
                       (pSVar24->m_ban_from_str)._M_string_length,
                       (pSVar24->m_ban_from_str)._M_dataplus._M_p,local_138,
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&pPVar21->vehicle + 0x18))->_M_allocated_capacity,
                       (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar21->vehicle + 0x10))->_M_allocated_capacity);
            message_02._M_str = local_1c8._M_dataplus._M_p;
            message_02._M_len = local_1c8._M_string_length;
            sendMessage(pSVar24,player,message_02);
            player_00.__r = (rep)extraout_RDX_09;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
            player_00.__r = (rep)extraout_RDX_11;
          }
        }
        if (pPVar27 != (PlayerInfo *)0x0) {
          local_178._M_dataplus._M_p =
               (pointer)((long)(((seconds *)((long)&pPVar27->name + 0x18))->__r * 1000000000 +
                               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)((long)&pPVar27->name + 0x10))->_M_allocated_capacity) /
                        1000000000);
          mineBan(pSVar24,player->id);
          ptVar16 = localtime((time_t *)&local_178);
          strftime((char *)local_138,0x100,"%b %d %Y at %H:%M:%S",ptVar16);
          if (((seconds *)((long)&pPVar27->name + 0x18))->__r == 0) {
            string_printf_abi_cxx11_
                      (&local_1c8,"You were permanently mine-banned from %.*s on %s for: %.*s",
                       (pSVar24->m_ban_from_str)._M_string_length,
                       (pSVar24->m_ban_from_str)._M_dataplus._M_p,local_138,
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&pPVar27->vehicle + 0x18))->_M_allocated_capacity,
                       (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar27->vehicle + 0x10))->_M_allocated_capacity);
            message_05._M_str = local_1c8._M_dataplus._M_p;
            message_05._M_len = local_1c8._M_string_length;
            sendMessage(pSVar24,player,message_05);
            player_00.__r = (rep)extraout_RDX_13;
          }
          else {
            string_printf_abi_cxx11_
                      (&local_1c8,"You are mine-banned from %.*s until %s for: %.*s",
                       (pSVar24->m_ban_from_str)._M_string_length,
                       (pSVar24->m_ban_from_str)._M_dataplus._M_p,local_138,
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&pPVar27->vehicle + 0x18))->_M_allocated_capacity,
                       (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar27->vehicle + 0x10))->_M_allocated_capacity);
            message_04._M_str = local_1c8._M_dataplus._M_p;
            message_04._M_len = local_1c8._M_string_length;
            sendMessage(pSVar24,player,message_04);
            player_00.__r = (rep)extraout_RDX_12;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
            player_00.__r = (rep)extraout_RDX_14;
          }
        }
        if (pPVar26 != (PlayerInfo *)0x0) {
          local_178._M_dataplus._M_p =
               (pointer)((long)(((seconds *)((long)&pPVar26->name + 0x18))->__r * 1000000000 +
                               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)((long)&pPVar26->name + 0x10))->_M_allocated_capacity) /
                        1000000000);
          ptVar16 = localtime((time_t *)&local_178);
          strftime((char *)local_138,0x100,"%b %d %Y at %H:%M:%S",ptVar16);
          if (((seconds *)((long)&pPVar26->name + 0x18))->__r == 0) {
            string_printf_abi_cxx11_
                      (&local_1c8,"You were permanently ladder-banned from %.*s on %s for: %.*s",
                       (pSVar24->m_ban_from_str)._M_string_length,
                       (pSVar24->m_ban_from_str)._M_dataplus._M_p,local_138,
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&pPVar26->vehicle + 0x18))->_M_allocated_capacity,
                       (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar26->vehicle + 0x10))->_M_allocated_capacity);
            message_07._M_str = local_1c8._M_dataplus._M_p;
            message_07._M_len = local_1c8._M_string_length;
            sendMessage(pSVar24,player,message_07);
            player_00.__r = (rep)extraout_RDX_16;
          }
          else {
            string_printf_abi_cxx11_
                      (&local_1c8,"You are ladder-banned from %.*s until %s for: %.*s",
                       (pSVar24->m_ban_from_str)._M_string_length,
                       (pSVar24->m_ban_from_str)._M_dataplus._M_p,local_138,
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&pPVar26->vehicle + 0x18))->_M_allocated_capacity,
                       (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)&pPVar26->vehicle + 0x10))->_M_allocated_capacity);
            message_06._M_str = local_1c8._M_dataplus._M_p;
            message_06._M_len = local_1c8._M_string_length;
            sendMessage(pSVar24,player,message_06);
            player_00.__r = (rep)extraout_RDX_15;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
            player_00.__r = (rep)extraout_RDX_17;
          }
        }
        if (pPVar28 != (PlayerInfo *)0x0) {
          getFormattedPlayerName_abi_cxx11_(&local_1c8,(RenX *)player,(PlayerInfo *)player_00.__r);
          string_printf_abi_cxx11_
                    (&local_178,
                     "\x0304[Alert] \x03\x02%.*s\x02\x03 is marked for monitoring by %.*s for: \"%.*s\". Please keep an eye on them in "
                     ,local_1c8._M_string_length,local_1c8._M_dataplus._M_p,
                     *(undefined8 *)((long)&pPVar28->character + 0x18),
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&pPVar28->character)[1]._M_allocated_capacity,
                     *(undefined8 *)((long)&pPVar28->vehicle + 0x18),
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&pPVar28->vehicle)[1]._M_allocated_capacity);
          string_printf_abi_cxx11_
                    (&local_158,
                     "\x0304[Alert] \x03\x02%.*s\x02\x03 is marked for monitoring by %.*s for: \"%.*s\".\x03"
                     ,local_1c8._M_string_length,local_1c8._M_dataplus._M_p,
                     *(undefined8 *)((long)&pPVar28->character + 0x18),
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&pPVar28->character)[1]._M_allocated_capacity,
                     *(undefined8 *)((long)&pPVar28->vehicle + 0x18),
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&pPVar28->vehicle)[1]._M_allocated_capacity);
          pPVar21 = (PlayerInfo *)0x0;
          while (pPVar17 = (PlayerInfo *)ServerManager::size(), pPVar21 < pPVar17) {
            uVar18 = ServerManager::getServer(_serverManager);
            local_1a0 = pPVar21;
            lVar19 = Jupiter::IRC::Client::getChannels_abi_cxx11_();
            for (puVar29 = *(undefined8 **)(lVar19 + 0x10); puVar29 != (undefined8 *)0x0;
                puVar29 = (undefined8 *)*puVar29) {
              iVar13 = Jupiter::IRC::Client::Channel::getType();
              if (pSVar24->m_adminLogChanType == iVar13) {
                auVar30 = Jupiter::IRC::Client::Channel::getName();
                Jupiter::IRC::Client::sendMessage
                          (uVar18,auVar30._0_8_,auVar30._8_8_,local_158._M_string_length,
                           local_158._M_dataplus._M_p);
                sVar8 = local_178._M_string_length;
                auVar30 = Jupiter::IRC::Client::Channel::getName();
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_178,auVar30._8_8_,auVar30._0_8_);
                local_1a8 = (PlayerInfo *)sVar8;
                lVar19 = Jupiter::IRC::Client::Channel::getUsers_abi_cxx11_();
                for (puVar23 = *(undefined8 **)(lVar19 + 0x10); puVar23 != (undefined8 *)0x0;
                    puVar23 = (undefined8 *)*puVar23) {
                  cVar11 = Jupiter::IRC::Client::Channel::getUserPrefix((User *)(puVar29 + 5));
                  if (cVar11 != '\0') {
                    auVar30 = Jupiter::IRC::Client::getNickname();
                    __n = auVar30._0_8_;
                    puVar20 = (undefined8 *)
                              Jupiter::IRC::Client::Channel::User::getNickname_abi_cxx11_();
                    if ((__n != puVar20[1]) ||
                       ((__n != 0 &&
                        (iVar13 = bcmp(auVar30._8_8_,(void *)*puVar20,__n), iVar13 != 0)))) {
                      Jupiter::IRC::Client::Channel::User::getUser();
                      puVar20 = (undefined8 *)Jupiter::IRC::Client::User::getNickname_abi_cxx11_();
                      Jupiter::IRC::Client::sendMessage
                                (uVar18,puVar20[1],*puVar20,local_178._M_string_length,
                                 local_178._M_dataplus._M_p);
                    }
                  }
                }
                if (local_178._M_string_length < local_1a8) {
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                             "basic_string::erase");
                }
                local_178._M_string_length = (size_type)local_1a8;
                local_178._M_dataplus._M_p[(long)local_1a8] = '\0';
                pSVar24 = local_190;
              }
            }
            pPVar21 = (PlayerInfo *)((long)&((fpos_t *)&local_1a0->joinTime)->__pos + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        local_178._M_dataplus._M_p =
             (pointer)((long)(((seconds *)((long)&pPVar17->name + 0x18))->__r * 1000000000 +
                             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)&pPVar17->name + 0x10))->_M_allocated_capacity) / 1000000000
                      );
        ptVar16 = localtime((time_t *)&local_178);
        strftime((char *)local_138,0x100,"%b %d %Y at %H:%M:%S",ptVar16);
        pSVar24 = local_190;
        if (((seconds *)((long)&pPVar17->name + 0x18))->__r == 0) {
          string_printf_abi_cxx11_
                    (&local_1c8,"You were permanently banned from %.*s on %s for: %.*s",
                     (local_190->m_ban_from_str)._M_string_length,
                     (local_190->m_ban_from_str)._M_dataplus._M_p,local_138,
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)&pPVar17->vehicle + 0x18))->_M_allocated_capacity,
                     (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar17->vehicle + 0x10))->_M_allocated_capacity);
          if ((player->exemption_flags & 4) == 0) {
            in_reason_00._M_str = local_1c8._M_dataplus._M_p;
            in_reason_00._M_len = local_1c8._M_string_length;
            forceKickPlayer(pSVar24,player->id,in_reason_00);
          }
        }
        else {
          string_printf_abi_cxx11_
                    (&local_1c8,"You are banned from %.*s until %s for: %.*s",
                     (local_190->m_ban_from_str)._M_string_length,
                     (local_190->m_ban_from_str)._M_dataplus._M_p,local_138,
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)&pPVar17->vehicle + 0x18))->_M_allocated_capacity,
                     (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)&pPVar17->vehicle + 0x10))->_M_allocated_capacity);
          if ((player->exemption_flags & 4) == 0) {
            in_reason._M_str = local_1c8._M_dataplus._M_p;
            in_reason._M_len = local_1c8._M_string_length;
            forceKickPlayer(pSVar24,player->id,in_reason);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        *(byte *)&player->ban_flags = (byte)player->ban_flags | 0x20;
      }
    }
  }
  return;
}

Assistant:

void RenX::Server::banCheck(RenX::PlayerInfo &player) {
	if ((player.exemption_flags & (RenX::ExemptionDatabase::Entry::FLAG_TYPE_BAN | RenX::ExemptionDatabase::Entry::FLAG_TYPE_KICK)) != 0) {
		return;
	}

	uint32_t netmask;

	RenX::BanDatabase::Entry* last_to_expire[7]; // TODO: what the fuck is this?
	for (size_t index = 0; index != sizeof(last_to_expire) / sizeof(RenX::BanDatabase::Entry *); ++index)
		last_to_expire[index] = nullptr;

	auto handle_type = [&last_to_expire](RenX::BanDatabase::Entry* entry, size_t index) {
		if (last_to_expire[index] == nullptr) {
			last_to_expire[index] = entry;
		}
		else if (last_to_expire[index]->length == std::chrono::seconds::zero()) {
			// favor older bans if they're also permanent
			if (entry->length == std::chrono::seconds::zero() && entry->timestamp < last_to_expire[index]->timestamp) {
				last_to_expire[index] = entry;
			}
		}
		else if (entry->length == std::chrono::seconds::zero() || entry->timestamp + entry->length > last_to_expire[index]->timestamp + last_to_expire[index]->length) {
			last_to_expire[index] = entry;
		}
	};

	for (const auto& entry : RenX::banDatabase->getEntries()) {
		if (entry->is_active()) {
			if (entry->length != std::chrono::seconds::zero() && entry->timestamp + entry->length < std::chrono::system_clock::now()) {
				banDatabase->deactivate(entry.get());
			}
			else {
				if (entry->prefix_length >= 32) {
					netmask = 0xFFFFFFFF;
				}
				else {
					netmask = Jupiter_prefix_length_to_netmask(entry->prefix_length);
				}

				if ((m_localSteamBan && entry->steamid != 0 && entry->steamid == player.steamid)
					|| (m_localIPBan && entry->ip != 0 && (entry->ip & netmask) == (player.ip32 & netmask))
					|| (m_localHWIDBan && !entry->hwid.empty() && entry->hwid == player.hwid)
					|| (m_localRDNSBan && !entry->rdns.empty() && entry->is_rdns_ban() && player.get_rdns().find(entry->rdns) != std::string::npos)
					|| (m_localNameBan && !entry->name.empty() && jessilib::equalsi(entry->name, player.name))) {
					player.ban_flags |= entry->flags;
					if (entry->is_type_game())
						handle_type(entry.get(), 0);
					if (entry->is_type_chat())
						handle_type(entry.get(), 1);
					if (entry->is_type_bot())
						handle_type(entry.get(), 2);
					if (entry->is_type_vote())
						handle_type(entry.get(), 3);
					if (entry->is_type_mine())
						handle_type(entry.get(), 4);
					if (entry->is_type_ladder())
						handle_type(entry.get(), 5);
					if (entry->is_type_alert())
						handle_type(entry.get(), 6);
				}
			}
		}
	}

	char timeStr[256];
	if (last_to_expire[0] != nullptr) { // Game ban
		time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[0]->timestamp + last_to_expire[0]->length);
		strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
		if (last_to_expire[0]->length == std::chrono::seconds::zero()) {
			forceKickPlayer(player, string_printf("You were permanently banned from %.*s on %s for: %.*s", m_ban_from_str.size(),
				m_ban_from_str.data(), timeStr, last_to_expire[0]->reason.size(), last_to_expire[0]->reason.data()));
		}
		else {
			forceKickPlayer(player, string_printf("You are banned from %.*s until %s for: %.*s", m_ban_from_str.size(),
				m_ban_from_str.data(), timeStr, last_to_expire[0]->reason.size(), last_to_expire[0]->reason.data()));
		}

		player.ban_flags |= RenX::BanDatabase::Entry::FLAG_TYPE_BOT; // implies FLAG_TYPE_BOT
	}
	else {
		if (last_to_expire[1] != nullptr) { // Chat ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[1]->timestamp + last_to_expire[1]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			mute(player);
			if (last_to_expire[1]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently muted from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[1]->reason.size(), last_to_expire[1]->reason.data()));
			else
				sendMessage(player, string_printf("You are muted from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[1]->reason.size(), last_to_expire[1]->reason.data()));

			player.ban_flags |= RenX::BanDatabase::Entry::FLAG_TYPE_BOT; // implies FLAG_TYPE_BOT
		}
		else if (last_to_expire[2] != nullptr) { // Bot ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[2]->timestamp + last_to_expire[2]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[2]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently bot-muted from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[2]->reason.size(), last_to_expire[2]->reason.data()));
			else
				sendMessage(player, string_printf("You are bot-muted from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[2]->reason.size(), last_to_expire[2]->reason.data()));
		}
		if (last_to_expire[3] != nullptr) { // Vote ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[3]->timestamp + last_to_expire[3]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[3]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently vote-muted from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[3]->reason.size(), last_to_expire[3]->reason.data()));
			else
				sendMessage(player, string_printf("You are vote-muted from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[3]->reason.size(), last_to_expire[3]->reason.data()));
		}
		if (last_to_expire[4] != nullptr) { // Mine ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[4]->timestamp + last_to_expire[4]->length);
			mineBan(player);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[4]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently mine-banned from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[4]->reason.size(), last_to_expire[4]->reason.data()));
			else
				sendMessage(player, string_printf("You are mine-banned from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[4]->reason.size(), last_to_expire[4]->reason.data()));
		}
		if (last_to_expire[5] != nullptr) { // Ladder ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[5]->timestamp + last_to_expire[5]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[5]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently ladder-banned from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[5]->reason.size(), last_to_expire[5]->reason.data()));
			else
				sendMessage(player, string_printf("You are ladder-banned from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[5]->reason.size(), last_to_expire[5]->reason.data()));
		}
		if (last_to_expire[6] != nullptr) { // Alert
			IRC_Bot *server;
			std::string fmtName = RenX::getFormattedPlayerName(player);
			std::string user_message = string_printf(IRCCOLOR "04[Alert] " IRCCOLOR IRCBOLD "%.*s" IRCBOLD IRCCOLOR " is marked for monitoring by %.*s for: \"%.*s\". Please keep an eye on them in ", fmtName.size(),
				fmtName.data(), last_to_expire[6]->banner.size(), last_to_expire[6]->banner.data(), last_to_expire[6]->reason.size(), last_to_expire[6]->reason.data());
			std::string channel_message = string_printf(IRCCOLOR "04[Alert] " IRCCOLOR IRCBOLD "%.*s" IRCBOLD IRCCOLOR " is marked for monitoring by %.*s for: \"%.*s\"." IRCCOLOR, fmtName.size(),
				fmtName.data(), last_to_expire[6]->banner.size(), last_to_expire[6]->banner.data(), last_to_expire[6]->reason.size(), last_to_expire[6]->reason.data());

			for (size_t server_index = 0; server_index < serverManager->size(); ++server_index) {
				server = serverManager->getServer(server_index);
				for (auto& channel : server->getChannels()) {
					if (isAdminLogChanType(channel.second.getType())) {
						server->sendMessage(channel.second.getName(), channel_message);

						size_t base_length = user_message.size();
						user_message += channel.second.getName();
						for (auto& user : channel.second.getUsers()) {
							if (channel.second.getUserPrefix(*user.second) != 0 && user.second->getNickname() != server->getNickname())
								server->sendMessage(user.second->getUser()->getNickname(), user_message);
						}
						user_message.erase(base_length);
					}
				}
			}
		}
	}
}